

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.c
# Opt level: O3

void fill_patch(double *ptr,int *dim,int *ld,int ndim,double val)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar11;
  
  auVar9 = _DAT_001b0020;
  auVar4 = _DAT_001b0010;
  if (ndim == 0) {
    GA_Error("fill_patch: error",0);
  }
  else if (ndim != 1) {
    if (ndim == 2) {
      iVar1 = *dim;
      if ((long)iVar1 < 1) {
        return;
      }
      iVar2 = *ld;
      uVar3 = dim[1];
      lVar7 = (ulong)uVar3 - 1;
      auVar13._8_4_ = (int)lVar7;
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
      pdVar6 = ptr + 1;
      lVar7 = 0;
      auVar13 = auVar13 ^ _DAT_001b0020;
      do {
        if (0 < (int)uVar3) {
          lVar8 = 0;
          auVar10 = auVar4;
          do {
            auVar12 = auVar10 ^ auVar9;
            if ((bool)(~(auVar13._4_4_ < auVar12._4_4_ ||
                        auVar13._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar13._4_4_) & 1)) {
              *(double *)((long)pdVar6 + lVar8 + -8) = val;
            }
            if (auVar12._12_4_ <= auVar13._12_4_ &&
                (auVar12._8_4_ <= auVar13._8_4_ || auVar12._12_4_ != auVar13._12_4_)) {
              *(double *)((long)pdVar6 + lVar8) = val;
            }
            lVar11 = auVar10._8_8_;
            auVar10._0_8_ = auVar10._0_8_ + 2;
            auVar10._8_8_ = lVar11 + 2;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)(uVar3 + 1 >> 1) << 4 != lVar8);
        }
        lVar7 = lVar7 + 1;
        pdVar6 = pdVar6 + iVar2;
      } while (lVar7 != iVar1);
      return;
    }
    lVar7 = 1;
    if (1 < ndim) {
      lVar7 = 1;
      uVar5 = 0;
      do {
        lVar7 = (long)(int)lVar7 * (long)ld[uVar5];
        uVar5 = uVar5 + 1;
      } while (ndim - 1U != uVar5);
    }
    if (*dim < 1) {
      return;
    }
    lVar8 = 0;
    do {
      fill_patch(ptr,dim + 1,ld + 1,ndim - 1U,val);
      lVar8 = lVar8 + 1;
      ptr = ptr + lVar7;
    } while (lVar8 < *dim);
    return;
  }
  auVar4 = _DAT_001b0020;
  iVar1 = *dim;
  if (0 < (long)iVar1) {
    lVar7 = (long)iVar1 + -1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar12 = auVar12 ^ _DAT_001b0020;
    auVar9 = _DAT_001b0010;
    do {
      auVar13 = auVar9 ^ auVar4;
      if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                  auVar12._4_4_ < auVar13._4_4_) & 1)) {
        *(double *)((long)ptr + lVar7) = val;
      }
      if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
          auVar13._12_4_ <= auVar12._12_4_) {
        *(double *)((long)ptr + lVar7 + 8) = val;
      }
      lVar8 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar8 + 2;
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(iVar1 + 1U >> 1) << 4 != lVar7);
  }
  return;
}

Assistant:

void fill_patch(double *ptr, int dim[], int ld[], int ndim, double val)
{
     int i, j, stride=1;

     switch (ndim){
     case 0: GA_Error("fill_patch: error",ndim);
     case 1: for(i=0;i <dim[0];i++)ptr[i]=val;
             break;
     case 2: for(i=0; i< dim[0]; i++){
               double *arr = ptr + i*ld[0];
               for(j=0; j< dim[1]; j++)arr[j]=val; 
             }
             break;
     default: 
             for(i=0; i<ndim-1; i++)stride *=ld[i];
             for(i=0; i<dim[0]; i++){
                 double *arr = ptr + stride*i;
                 fill_patch(arr, dim+1, ld+1, ndim-1, val);
             } 
     }
}